

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall
base_iterator_matrix_sparse_element_test_constructor_and_dereference_Test::
~base_iterator_matrix_sparse_element_test_constructor_and_dereference_Test
          (base_iterator_matrix_sparse_element_test_constructor_and_dereference_Test *this)

{
  base_iterator_matrix_sparse_element_test_constructor_and_dereference_Test *this_local;
  
  base_iterator_matrix_sparse_element_test::~base_iterator_matrix_sparse_element_test
            (&this->super_base_iterator_matrix_sparse_element_test);
  return;
}

Assistant:

TEST_F(base_iterator_matrix_sparse_element_test, constructor_and_dereference) {
  Base_Iterator_Matrix_Sparse_Element<double, int, false> iter(&columns[0], &entries[0]);
  auto element = *iter;
  EXPECT_EQ(element.i_column(), 0);
  EXPECT_EQ(element.value(), 1.0);
}